

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O0

void * __thiscall
vk::AllocationCallbackRecorder::reallocate
          (AllocationCallbackRecorder *this,void *original,size_t size,size_t alignment,
          VkSystemAllocationScope allocationScope)

{
  AllocationCallbackRecord local_68;
  void *local_38;
  void *ptr;
  size_t sStack_28;
  VkSystemAllocationScope allocationScope_local;
  size_t alignment_local;
  size_t size_local;
  void *original_local;
  AllocationCallbackRecorder *this_local;
  
  ptr._4_4_ = allocationScope;
  sStack_28 = alignment;
  alignment_local = size;
  size_local = (size_t)original;
  original_local = this;
  local_38 = ChainedAllocator::reallocate
                       (&this->super_ChainedAllocator,original,size,alignment,allocationScope);
  AllocationCallbackRecord::reallocation
            (&local_68,(void *)size_local,alignment_local,sStack_28,ptr._4_4_,local_38);
  de::AppendList<vk::AllocationCallbackRecord>::append(&this->m_records,&local_68);
  return local_38;
}

Assistant:

void* AllocationCallbackRecorder::reallocate (void* original, size_t size, size_t alignment, VkSystemAllocationScope allocationScope)
{
	void* const	ptr	= ChainedAllocator::reallocate(original, size, alignment, allocationScope);

	m_records.append(AllocationCallbackRecord::reallocation(original, size, alignment, allocationScope, ptr));

	return ptr;
}